

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall
PiecewiseConstant1D_Continuous_Test::~PiecewiseConstant1D_Continuous_Test
          (PiecewiseConstant1D_Continuous_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PiecewiseConstant1D, Continuous) {
    PiecewiseConstant1D dist({1.f, 1.f, 2.f, 4.f, 8.f});
    EXPECT_EQ(5, dist.size());

    Float pdf;
    int offset;
    EXPECT_EQ(0., dist.Sample(0., &pdf, &offset));
    EXPECT_FLOAT_EQ(dist.size() * 1. / 16., pdf);
    EXPECT_EQ(0, offset);

    // Right at the bounary between the 4 and the 8 segments.
    EXPECT_FLOAT_EQ(.8, dist.Sample(0.5, &pdf, &offset));

    // Middle of the 8 segment
    EXPECT_FLOAT_EQ(.9, dist.Sample(0.75, &pdf, &offset));
    EXPECT_FLOAT_EQ(dist.size() * 8. / 16., pdf);
    EXPECT_EQ(4, offset);

    EXPECT_FLOAT_EQ(0., dist.Sample(0., &pdf));
    EXPECT_FLOAT_EQ(1., dist.Sample(1., &pdf));
}